

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfloat.cpp
# Opt level: O0

mat4f * inverse(mat4f a)

{
  float *src;
  float *dst;
  mat4f *in_RDI;
  mat4f *b;
  
  mat4f::mat4f((mat4f *)0x18a9b0);
  src = mat4f::operator[]((mat4f *)&stack0x00000008,0);
  dst = mat4f::operator[](in_RDI,0);
  anon_unknown.dwarf_af6d6::invert4x4(src,dst);
  return in_RDI;
}

Assistant:

mat4f inverse(mat4f a)
{
    // a,b should be either row-major or column-major
    assert(sizeof(a) == 16*sizeof(float));
    mat4f b;
    invert4x4(a[0], b[0]);
    return b;
}